

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void palette_reset(Terminal *term,_Bool keep_overrides)

{
  int iVar1;
  uint8_t *puVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint8_t uVar7;
  int *piVar8;
  int secondary;
  long lVar9;
  ulong uVar10;
  uint8_t uVar11;
  
  memset(term->subpalettes[0].present,1,0x106);
  piVar8 = colour_indices_conf_to_osc4;
  lVar9 = 0;
  do {
    iVar4 = *piVar8;
    secondary = (int)lVar9;
    iVar1 = conf_get_int_int(term->conf,0x95,secondary);
    term->subpalettes[0].values[iVar4].r = (uint8_t)iVar1;
    iVar1 = conf_get_int_int(term->conf,0x95,secondary + 1);
    term->subpalettes[0].values[iVar4].g = (uint8_t)iVar1;
    iVar1 = conf_get_int_int(term->conf,0x95,secondary + 2);
    term->subpalettes[0].values[iVar4].b = (uint8_t)iVar1;
    lVar9 = lVar9 + 3;
    piVar8 = piVar8 + 1;
  } while (lVar9 != 0x42);
  puVar2 = &term->subpalettes[0].values[0x10].b;
  cVar3 = '7';
  iVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  do {
    uVar7 = (char)((ulong)uVar5 / 6) * '\x10' + cVar3;
    uVar10 = uVar6 & 0xffffffff;
    iVar1 = (int)(uVar10 / 6) + (int)(uVar10 / 0x24) * -6;
    uVar11 = ((byte)(uVar10 * 0x38e38e39 >> 0x20) & 0xf8) * '\x05' + '7';
    if (uVar6 < 0x24) {
      uVar11 = '\0';
    }
    ((rgb *)(puVar2 + -2))->r = uVar11;
    uVar11 = (char)iVar1 * '(' + '7';
    if (iVar1 == 0) {
      uVar11 = '\0';
    }
    if ((uVar5 / 6) * 6 + iVar4 == 0) {
      uVar7 = '\0';
    }
    puVar2[-1] = uVar11;
    *puVar2 = uVar7;
    uVar6 = uVar6 + 1;
    cVar3 = cVar3 + '(';
    uVar5 = uVar5 + 1;
    iVar4 = iVar4 + -1;
    puVar2 = puVar2 + 3;
  } while (uVar6 != 0xd8);
  cVar3 = '\b';
  lVar9 = 0x151a;
  do {
    *(char *)((long)&term->compatibility_level + lVar9) = cVar3;
    *(char *)((long)term + lVar9 + -1) = cVar3;
    *(char *)((long)term + lVar9 + -2) = cVar3;
    cVar3 = cVar3 + '\n';
    lVar9 = lVar9 + 3;
  } while (lVar9 != 0x1562);
  memset(term->subpalettes[1].present,0,0x106);
  (*term->win->vt->palette_get_overrides)(term->win,term);
  if (!keep_overrides) {
    memset(term->subpalettes[2].present,0,0x106);
  }
  palette_rebuild(term);
  return;
}

Assistant:

static void palette_reset(Terminal *term, bool keep_overrides)
{
    for (unsigned i = 0; i < OSC4_NCOLOURS; i++)
        term->subpalettes[SUBPAL_CONF].present[i] = true;

    /*
     * Copy all the palette information out of the Conf.
     */
    for (unsigned i = 0; i < CONF_NCOLOURS; i++) {
        rgb *col = &term->subpalettes[SUBPAL_CONF].values[
            colour_indices_conf_to_osc4[i]];
        col->r = conf_get_int_int(term->conf, CONF_colours, i*3+0);
        col->g = conf_get_int_int(term->conf, CONF_colours, i*3+1);
        col->b = conf_get_int_int(term->conf, CONF_colours, i*3+2);
    }

    /*
     * Directly invent the rest of the xterm-256 colours.
     */
    for (unsigned i = 0; i < 216; i++) {
        rgb *col = &term->subpalettes[SUBPAL_CONF].values[i + 16];
        int r = i / 36, g = (i / 6) % 6, b = i % 6;
        col->r = r ? r * 40 + 55 : 0;
        col->g = g ? g * 40 + 55 : 0;
        col->b = b ? b * 40 + 55 : 0;
    }
    for (unsigned i = 0; i < 24; i++) {
        rgb *col = &term->subpalettes[SUBPAL_CONF].values[i + 232];
        int shade = i * 10 + 8;
        col->r = col->g = col->b = shade;
    }

    /*
     * Re-fetch any OS-local overrides.
     */
    for (unsigned i = 0; i < OSC4_NCOLOURS; i++)
        term->subpalettes[SUBPAL_PLATFORM].present[i] = false;
    win_palette_get_overrides(term->win, term);

    if (!keep_overrides) {
        /*
         * Get rid of all escape-sequence configuration.
         */
        for (unsigned i = 0; i < OSC4_NCOLOURS; i++)
            term->subpalettes[SUBPAL_SESSION].present[i] = false;
    }

    /*
     * Rebuild the composite palette.
     */
    palette_rebuild(term);
}